

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_converter.cpp
# Opt level: O3

unsafe_unique_array<char> __thiscall duckdb::AddName(duckdb *this,string *name)

{
  size_type sVar1;
  pointer pcVar2;
  void *__s;
  size_type sVar3;
  
  sVar1 = name->_M_string_length;
  __s = operator_new__(sVar1 + 1);
  switchD_00569a20::default(__s,0,sVar1 + 1);
  *(void **)this = __s;
  if (sVar1 != 0) {
    pcVar2 = (name->_M_dataplus)._M_p;
    sVar3 = 0;
    do {
      *(char *)((long)__s + sVar3) = pcVar2[sVar3];
      sVar3 = sVar3 + 1;
    } while (sVar1 != sVar3);
  }
  *(undefined1 *)((long)__s + sVar1) = 0;
  return (unique_ptr<char[],_std::default_delete<char[]>_>)
         (unique_ptr<char[],_std::default_delete<char[]>_>)this;
}

Assistant:

unsafe_unique_array<char> AddName(const string &name) {
	auto name_ptr = make_unsafe_uniq_array<char>(name.size() + 1);
	for (size_t i = 0; i < name.size(); i++) {
		name_ptr[i] = name[i];
	}
	name_ptr[name.size()] = '\0';
	return name_ptr;
}